

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_extend(HSQUIRRELVM v)

{
  SQArray *this;
  SQObjectPtr *pSVar1;
  SQInteger SVar2;
  SQRESULT SVar3;
  char *err;
  long lVar4;
  long lVar5;
  long nelemstopop;
  bool bVar6;
  
  pSVar1 = stack_get(v,1);
  if (((pSVar1->super_SQObject)._flags & 1) == 0) {
    pSVar1 = stack_get(v,1);
    this = (pSVar1->super_SQObject)._unVal.pArray;
    SVar2 = sq_gettop(v);
    nelemstopop = SVar2 + -1;
    lVar4 = 0;
    lVar5 = 0;
    if (0 < nelemstopop) {
      lVar5 = nelemstopop;
    }
    while( true ) {
      bVar6 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar6) {
        sq_pop(v,nelemstopop);
        return 1;
      }
      pSVar1 = stack_get(v,lVar4 + 2);
      if ((pSVar1->super_SQObject)._type != OT_ARRAY) break;
      SQArray::Extend(this,(pSVar1->super_SQObject)._unVal.pArray);
      lVar4 = lVar4 + 1;
    }
    err = "only arrays can be used to extend array";
  }
  else {
    err = "Cannot modify immutable object";
  }
  SVar3 = sq_throwerror(v,err);
  return SVar3;
}

Assistant:

static SQInteger array_extend(HSQUIRRELVM v)
{
    SQ_CHECK_IMMUTABLE_SELF;

    SQArray *arr = _array(stack_get(v, 1));
    SQInteger n = sq_gettop(v)-1;
    for (SQInteger i=0; i<n; ++i) {
        SQObject &o=stack_get(v,2+i);
        if (sq_type(o) != OT_ARRAY)
            return sq_throwerror(v, _SC("only arrays can be used to extend array"));
        arr->Extend(_array(o));
    }
    sq_pop(v,n);
    return 1;
}